

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

ssize_t zip_entries_delete_mark(zip_t *zip,zip_entry_mark_t *entry_mark,int entry_num)

{
  mz_zip_internal_state *pState_00;
  int iVar1;
  int *deleted_entry_index_array;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  mz_uint32 offset;
  mz_uint8 *p;
  mz_zip_internal_state *pState;
  mz_bool *deleted_entry_flag_array;
  ssize_t n;
  size_t deleted_entry_num;
  size_t sStack_58;
  int i;
  size_t move_length;
  size_t deleted_length;
  mz_uint64 read_num;
  mz_uint64 writen_num;
  int entry_num_local;
  zip_entry_mark_t *entry_mark_local;
  zip_t *zip_local;
  
  read_num = 0;
  deleted_length = 0;
  move_length = 0;
  sStack_58 = 0;
  deleted_entry_num._4_4_ = 0;
  n = 0;
  deleted_entry_index_array = (int *)calloc((long)entry_num,4);
  if (deleted_entry_index_array == (int *)0x0) {
    zip_local = (zip_t *)0xffffffffffffffeb;
  }
  else {
    pState_00 = (zip->archive).m_pState;
    (zip->archive).m_zip_mode = MZ_ZIP_MODE_WRITING;
    if ((pState_00->m_pFile == (FILE *)0x0) ||
       (iVar1 = fseeko((FILE *)pState_00->m_pFile,0,0), iVar1 == 0)) {
      while (deleted_entry_num._4_4_ < entry_num) {
        while( true ) {
          bVar4 = false;
          if (deleted_entry_num._4_4_ < entry_num) {
            bVar4 = entry_mark[deleted_entry_num._4_4_].type == MZ_KEEP;
          }
          if (!bVar4) break;
          deleted_length = entry_mark[deleted_entry_num._4_4_].lf_length + read_num;
          deleted_entry_num._4_4_ = deleted_entry_num._4_4_ + 1;
          read_num = deleted_length;
        }
        while( true ) {
          bVar4 = false;
          if (deleted_entry_num._4_4_ < entry_num) {
            bVar4 = entry_mark[deleted_entry_num._4_4_].type == MZ_DELETE;
          }
          if (!bVar4) break;
          deleted_entry_index_array[deleted_entry_num._4_4_] = 1;
          deleted_length = entry_mark[deleted_entry_num._4_4_].lf_length + deleted_length;
          move_length = entry_mark[deleted_entry_num._4_4_].lf_length + move_length;
          deleted_entry_num._4_4_ = deleted_entry_num._4_4_ + 1;
          n = n + 1;
        }
        while( true ) {
          bVar4 = false;
          if (deleted_entry_num._4_4_ < entry_num) {
            bVar4 = entry_mark[deleted_entry_num._4_4_].type == MZ_MOVE;
          }
          if (!bVar4) break;
          sStack_58 = sStack_58 + entry_mark[deleted_entry_num._4_4_].lf_length;
          lVar2 = (long)(pState_00->m_central_dir).m_p +
                  (ulong)*(uint *)((long)(pState_00->m_central_dir_offsets).m_p +
                                  (long)deleted_entry_num._4_4_ * 4);
          if (lVar2 == 0) {
            if (deleted_entry_index_array != (int *)0x0) {
              free(deleted_entry_index_array);
            }
            return -3;
          }
          iVar1 = *(int *)(lVar2 + 0x2a) - (int)move_length;
          *(char *)(lVar2 + 0x2a) = (char)iVar1;
          *(char *)(lVar2 + 0x2b) = (char)((uint)iVar1 >> 8);
          *(char *)(lVar2 + 0x2c) = (char)((uint)iVar1 >> 0x10);
          *(char *)(lVar2 + 0x2d) = (char)((uint)iVar1 >> 0x18);
          deleted_entry_num._4_4_ = deleted_entry_num._4_4_ + 1;
        }
        sVar3 = zip_files_move(zip,read_num,deleted_length,sStack_58);
        if (sVar3 != sStack_58) {
          if (deleted_entry_index_array == (int *)0x0) {
            return sVar3;
          }
          free(deleted_entry_index_array);
          return sVar3;
        }
        read_num = sStack_58 + read_num;
        deleted_length = sStack_58 + deleted_length;
      }
      (zip->archive).m_archive_size = (zip->archive).m_archive_size - move_length;
      (zip->archive).m_total_files = entry_num - (int)n;
      zip_central_dir_delete(pState_00,deleted_entry_index_array,entry_num);
      if (deleted_entry_index_array != (int *)0x0) {
        free(deleted_entry_index_array);
      }
      zip_local = (zip_t *)n;
    }
    else {
      if (deleted_entry_index_array != (int *)0x0) {
        free(deleted_entry_index_array);
      }
      zip_local = (zip_t *)0xfffffffffffffffd;
    }
  }
  return (ssize_t)zip_local;
}

Assistant:

static ssize_t zip_entries_delete_mark(struct zip_t *zip,
                                       struct zip_entry_mark_t *entry_mark,
                                       int entry_num) {
  mz_uint64 writen_num = 0;
  mz_uint64 read_num = 0;
  size_t deleted_length = 0;
  size_t move_length = 0;
  int i = 0;
  size_t deleted_entry_num = 0;
  ssize_t n = 0;

  mz_bool *deleted_entry_flag_array =
      (mz_bool *)calloc(entry_num, sizeof(mz_bool));
  if (deleted_entry_flag_array == NULL) {
    return ZIP_EOOMEM;
  }

  mz_zip_internal_state *pState = zip->archive.m_pState;
  zip->archive.m_zip_mode = MZ_ZIP_MODE_WRITING;

  if (pState->m_pFile) {
    if (MZ_FSEEK64(pState->m_pFile, 0, SEEK_SET)) {
      CLEANUP(deleted_entry_flag_array);
      return ZIP_ENOENT;
    }
  }

  while (i < entry_num) {
    while ((i < entry_num) && (entry_mark[i].type == MZ_KEEP)) {
      writen_num += entry_mark[i].lf_length;
      read_num = writen_num;
      i++;
    }

    while ((i < entry_num) && (entry_mark[i].type == MZ_DELETE)) {
      deleted_entry_flag_array[i] = MZ_TRUE;
      read_num += entry_mark[i].lf_length;
      deleted_length += entry_mark[i].lf_length;
      i++;
      deleted_entry_num++;
    }

    while ((i < entry_num) && (entry_mark[i].type == MZ_MOVE)) {
      move_length += entry_mark[i].lf_length;
      mz_uint8 *p = &MZ_ZIP_ARRAY_ELEMENT(
          &pState->m_central_dir, mz_uint8,
          MZ_ZIP_ARRAY_ELEMENT(&pState->m_central_dir_offsets, mz_uint32, i));
      if (!p) {
        CLEANUP(deleted_entry_flag_array);
        return ZIP_ENOENT;
      }
      mz_uint32 offset = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
      offset -= (mz_uint32)deleted_length;
      MZ_WRITE_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS, offset);
      i++;
    }

    n = zip_files_move(zip, writen_num, read_num, move_length);
    if (n != (ssize_t)move_length) {
      CLEANUP(deleted_entry_flag_array);
      return n;
    }
    writen_num += move_length;
    read_num += move_length;
  }

  zip->archive.m_archive_size -= (mz_uint64)deleted_length;
  zip->archive.m_total_files =
      (mz_uint32)entry_num - (mz_uint32)deleted_entry_num;

  zip_central_dir_delete(pState, deleted_entry_flag_array, entry_num);
  CLEANUP(deleted_entry_flag_array);

  return (ssize_t)deleted_entry_num;
}